

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.c
# Opt level: O1

int Shift(uint8_t *word,int word_len,uint16_t parameter)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  
  bVar1 = *word;
  if (-1 < (char)bVar1) {
    *word = (char)parameter + bVar1 & 0x7f;
    return 1;
  }
  iVar3 = 1;
  if (0xbf < bVar1) {
    iVar2 = ((parameter & 0x7fff) - (parameter & 0x8000)) + 0x1000000;
    if (bVar1 < 0xe0) {
      if (1 < word_len) {
        uVar4 = ((bVar1 & 0x1f) << 6 | word[1] & 0x3f) + iVar2;
        *word = (byte)(uVar4 >> 6) & 0x1f | 0xc0;
        word[1] = (byte)uVar4 & 0x3f | word[1] & 0xc0;
        return 2;
      }
    }
    else if (bVar1 < 0xf0) {
      iVar3 = word_len;
      if (2 < word_len) {
        iVar3 = iVar2 + (word[2] & 0x3f) + (bVar1 & 0xf) * 0x1000;
        uVar4 = (word[1] & 0x3f) * 0x40 + iVar3;
        *word = (byte)(uVar4 >> 0xc) & 0xf | 0xe0;
        word[1] = (byte)(uVar4 >> 6) & 0x3f | word[1] & 0xc0;
        word[2] = (byte)iVar3 & 0x3f | word[2] & 0xc0;
        return 3;
      }
    }
    else if ((bVar1 < 0xf8) && (iVar3 = word_len, 3 < word_len)) {
      iVar3 = iVar2 + (word[3] & 0x3f) + (bVar1 & 7) * 0x40000;
      uVar4 = (word[2] & 0x3f) * 0x40 + iVar3;
      uVar5 = (word[1] & 0x3f) * 0x1000 + uVar4;
      *word = (byte)(uVar5 >> 0x12) & 7 | 0xf0;
      word[1] = (byte)(uVar5 >> 0xc) & 0x3f | word[1] & 0xc0;
      word[2] = (byte)(uVar4 >> 6) & 0x3f | word[2] & 0xc0;
      word[3] = (byte)iVar3 & 0x3f | word[3] & 0xc0;
      return 4;
    }
  }
  return iVar3;
}

Assistant:

static int Shift(uint8_t* word, int word_len, uint16_t parameter) {
  /* Limited sign extension: scalar < (1 << 24). */
  uint32_t scalar =
      (parameter & 0x7FFFu) + (0x1000000u - (parameter & 0x8000u));
  if (word[0] < 0x80) {
    /* 1-byte rune / 0sssssss / 7 bit scalar (ASCII). */
    scalar += (uint32_t)word[0];
    word[0] = (uint8_t)(scalar & 0x7Fu);
    return 1;
  } else if (word[0] < 0xC0) {
    /* Continuation / 10AAAAAA. */
    return 1;
  } else if (word[0] < 0xE0) {
    /* 2-byte rune / 110sssss AAssssss / 11 bit scalar. */
    if (word_len < 2) return 1;
    scalar += (uint32_t)((word[1] & 0x3Fu) | ((word[0] & 0x1Fu) << 6u));
    word[0] = (uint8_t)(0xC0 | ((scalar >> 6u) & 0x1F));
    word[1] = (uint8_t)((word[1] & 0xC0) | (scalar & 0x3F));
    return 2;
  } else if (word[0] < 0xF0) {
    /* 3-byte rune / 1110ssss AAssssss BBssssss / 16 bit scalar. */
    if (word_len < 3) return word_len;
    scalar += (uint32_t)((word[2] & 0x3Fu) | ((word[1] & 0x3Fu) << 6u) |
        ((word[0] & 0x0Fu) << 12u));
    word[0] = (uint8_t)(0xE0 | ((scalar >> 12u) & 0x0F));
    word[1] = (uint8_t)((word[1] & 0xC0) | ((scalar >> 6u) & 0x3F));
    word[2] = (uint8_t)((word[2] & 0xC0) | (scalar & 0x3F));
    return 3;
  } else if (word[0] < 0xF8) {
    /* 4-byte rune / 11110sss AAssssss BBssssss CCssssss / 21 bit scalar. */
    if (word_len < 4) return word_len;
    scalar += (uint32_t)((word[3] & 0x3Fu) | ((word[2] & 0x3Fu) << 6u) |
        ((word[1] & 0x3Fu) << 12u) | ((word[0] & 0x07u) << 18u));
    word[0] = (uint8_t)(0xF0 | ((scalar >> 18u) & 0x07));
    word[1] = (uint8_t)((word[1] & 0xC0) | ((scalar >> 12u) & 0x3F));
    word[2] = (uint8_t)((word[2] & 0xC0) | ((scalar >> 6u) & 0x3F));
    word[3] = (uint8_t)((word[3] & 0xC0) | (scalar & 0x3F));
    return 4;
  }
  return 1;
}